

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

IGUITab * __thiscall
irr::gui::CGUITabControl::insertTab(CGUITabControl *this,s32 idx,wchar_t *caption,s32 id)

{
  u32 uVar1;
  CGUITabControl *this_00;
  EGUI_ALIGNMENT in_ECX;
  IGUIElement *in_RDX;
  int in_ESI;
  CGUITabControl *in_RDI;
  rect<int> rVar2;
  CGUITab *tab;
  undefined1 auVar3 [12];
  undefined8 in_stack_ffffffffffffffd0;
  s32 id_00;
  EGUI_ALIGNMENT in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  CGUITabControl *this_01;
  CGUITabControl *local_8;
  
  id_00 = (s32)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if ((in_ESI < 0) ||
     (iVar4 = in_ESI, this_01 = in_RDI,
     uVar1 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cf950),
     (int)uVar1 < in_ESI)) {
    local_8 = (CGUITabControl *)0x0;
  }
  else {
    this_00 = (CGUITabControl *)operator_new(0x160);
    rVar2 = calcTabPos(this_00);
    auVar3 = rVar2._4_12_;
    CGUITab::CGUITab((CGUITab *)this_01,(IGUIEnvironment *)CONCAT44(iVar4,in_stack_ffffffffffffffe8)
                     ,in_RDX,(rect<int> *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),id_00);
    local_8 = this_00;
    (**(code **)(*(long *)this_00 + 0xa0))(this_00,in_RDX);
    IGUIElement::setAlignment
              (in_RDX,in_ECX,in_stack_ffffffffffffffd8,(EGUI_ALIGNMENT)((ulong)local_8 >> 0x20),
               (EGUI_ALIGNMENT)local_8);
    (**(code **)(*(long *)local_8 + 0x78))(local_8,0);
    core::array<irr::gui::IGUITab_*>::insert
              ((array<irr::gui::IGUITab_*> *)local_8,auVar3._4_8_,auVar3._0_4_);
    if (in_RDI->ActiveTabIndex == -1) {
      in_RDI->ActiveTabIndex = iVar4;
      (**(code **)(*(long *)local_8 + 0x78))(local_8,1);
    }
    else if (iVar4 <= in_RDI->ActiveTabIndex) {
      in_RDI->ActiveTabIndex = in_RDI->ActiveTabIndex + 1;
      setVisibleTab(in_RDI,in_ESI);
    }
    recalculateScrollBar(this_00);
  }
  return (IGUITab *)local_8;
}

Assistant:

IGUITab *CGUITabControl::insertTab(s32 idx, const wchar_t *caption, s32 id)
{
	if (idx < 0 || idx > (s32)Tabs.size()) // idx == Tabs.size() is indeed OK here as core::array can handle that
		return NULL;

	CGUITab *tab = new CGUITab(Environment, this, calcTabPos(), id);

	tab->setText(caption);
	tab->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	tab->setVisible(false);
	Tabs.insert(tab, (u32)idx);

	if (ActiveTabIndex == -1) {
		ActiveTabIndex = (u32)idx;
		tab->setVisible(true);
	} else if (idx <= ActiveTabIndex) {
		++ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	}

	recalculateScrollBar();

	return tab;
}